

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O1

bool __thiscall
Jinx::Impl::Library::RegisterPropertyName
          (Library *this,PropertyName *propertyName,bool checkForDuplicates)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_propertyMutex);
  if (iVar2 == 0) {
    bVar1 = RegisterPropertyNameInternal(this,propertyName,checkForDuplicates);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

inline_t bool Library::RegisterPropertyName(const PropertyName & propertyName, bool checkForDuplicates)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return RegisterPropertyNameInternal(propertyName, checkForDuplicates);
	}